

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  undefined1 *puVar1;
  char cVar2;
  curl_trc_feat *pcVar3;
  Curl_addrinfo *pCVar4;
  int iVar5;
  size_t sVar6;
  Curl_addrinfo *pCVar7;
  void *pvVar8;
  Curl_dns_entry *p;
  char *pcVar9;
  curl_slist *pcVar10;
  CURLcode CVar11;
  Curl_addrinfo *pCVar12;
  Curl_hash *h;
  size_t in_R8;
  Curl_addrinfo *addr;
  Curl_multi *pCVar13;
  curl_off_t port;
  Curl_str source;
  char *host;
  char address [64];
  curl_off_t num;
  char entry_id [262];
  size_t local_2c0;
  Curl_str local_2b8;
  char *local_2a8;
  Curl_multi *local_2a0;
  Curl_hash *local_298;
  char *local_290;
  char local_288 [64];
  Curl_str local_248 [17];
  char local_138 [264];
  
  pCVar13 = (Curl_multi *)data->share;
  if (((pCVar13 == (Curl_multi *)0x0) || ((pCVar13->xfers_alive & 8) == 0)) &&
     (pCVar13 = data->multi, pCVar13 == (Curl_multi *)0x0)) {
    CVar11 = CURLE_FAILED_INIT;
  }
  else {
    puVar1 = &(data->state).field_0x7c0;
    *puVar1 = *puVar1 & 0xfb;
    pcVar10 = (data->state).resolve;
    if (pcVar10 != (curl_slist *)0x0) {
      h = &(pCVar13->dnscache).entries;
      do {
        local_2a8 = pcVar10->data;
        if (local_2a8 != (char *)0x0) {
          if (*local_2a8 == '-') {
            local_248[0].str = (char *)0x0;
            local_2a8 = local_2a8 + 1;
            iVar5 = Curl_str_single(&local_2a8,'[');
            if (iVar5 == 0) {
              iVar5 = Curl_str_until(&local_2a8,&local_2b8,0x2e,']');
              if (iVar5 != 0) goto LAB_00132af8;
              iVar5 = Curl_str_single(&local_2a8,']');
            }
            else {
              iVar5 = Curl_str_until(&local_2a8,&local_2b8,0x1000,':');
            }
            if (((iVar5 == 0) && (iVar5 = Curl_str_single(&local_2a8,':'), iVar5 == 0)) &&
               (iVar5 = Curl_str_number(&local_2a8,(curl_off_t *)local_248,0xffff), iVar5 == 0)) {
              sVar6 = create_dnscache_id(local_2b8.str,
                                         CONCAT44(local_2b8.len._4_4_,(uint)local_2b8.len),
                                         (int)local_248[0].str,local_138,in_R8);
              if ((Curl_multi *)data->share == pCVar13) {
                Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
              }
              Curl_hash_delete(h,local_138,sVar6 + 1);
              if ((Curl_multi *)data->share == pCVar13) {
                Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
              }
            }
          }
          else {
            local_2c0 = 0;
            cVar2 = *local_2a8;
            if (cVar2 == '+') {
              local_2a8 = local_2a8 + 1;
            }
            iVar5 = Curl_str_single(&local_2a8,'[');
            if (iVar5 == 0) {
              iVar5 = Curl_str_until(&local_2a8,&local_2b8,0x2e,']');
              if (iVar5 != 0) goto LAB_00132af8;
              iVar5 = Curl_str_single(&local_2a8,']');
            }
            else {
              iVar5 = Curl_str_until(&local_2a8,&local_2b8,0x1000,':');
            }
            if (iVar5 == 0) {
              iVar5 = Curl_str_single(&local_2a8,':');
              if (((iVar5 != 0) ||
                  (iVar5 = Curl_str_number(&local_2a8,(curl_off_t *)&local_2c0,0xffff), iVar5 != 0))
                 || ((iVar5 = Curl_str_single(&local_2a8,':'), iVar5 != 0 || (*local_2a8 == '\0'))))
              {
                addr = (Curl_addrinfo *)0x0;
LAB_00132d8e:
                Curl_failf(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'",pcVar10->data);
                Curl_freeaddrinfo(addr);
                return CURLE_SETOPT_OPTION_SYNTAX;
              }
              local_290 = local_2a8;
              addr = (Curl_addrinfo *)0x0;
              pCVar12 = (Curl_addrinfo *)0x0;
              local_2a0 = pCVar13;
              local_298 = h;
              do {
                iVar5 = Curl_str_single(&local_2a8,'[');
                if (iVar5 == 0) {
                  iVar5 = Curl_str_until(&local_2a8,local_248,0x2e,']');
                  if ((iVar5 != 0) || (iVar5 = Curl_str_single(&local_2a8,']'), iVar5 != 0))
                  goto LAB_00132d8e;
LAB_00132a26:
                  sVar6 = local_248[0].len;
                  if (0x3f < local_248[0].len) goto LAB_00132d8e;
                  memcpy(local_288,local_248[0].str,local_248[0].len);
                  local_288[sVar6] = '\0';
                  pCVar7 = Curl_str2addr(local_288,(int)local_2c0);
                  if (pCVar7 == (Curl_addrinfo *)0x0) {
                    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                       ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar3->log_level)))) {
                      Curl_infof(data,"Resolve address \'%s\' found illegal",local_288);
                    }
                    goto LAB_00132d8e;
                  }
                  pCVar4 = pCVar7;
                  if (pCVar12 != (Curl_addrinfo *)0x0) {
                    pCVar12->ai_next = pCVar7;
                    pCVar4 = addr;
                  }
                  addr = pCVar4;
                  iVar5 = Curl_str_single(&local_2a8,',');
                  if (iVar5 != 0) break;
                }
                else {
                  iVar5 = Curl_str_until(&local_2a8,local_248,0x1000,',');
                  if (iVar5 == 0) goto LAB_00132a26;
                  iVar5 = Curl_str_single(&local_2a8,',');
                  pCVar7 = pCVar12;
                  if (iVar5 != 0) goto LAB_00132d8e;
                }
                pCVar12 = pCVar7;
              } while (*local_2a8 != '\0');
              if (addr == (Curl_addrinfo *)0x0) {
                addr = (Curl_addrinfo *)0x0;
                goto LAB_00132d8e;
              }
              sVar6 = create_dnscache_id(local_2b8.str,
                                         CONCAT44(local_2b8.len._4_4_,(uint)local_2b8.len),
                                         (int)local_2c0,local_138,in_R8);
              if ((Curl_multi *)data->share == local_2a0) {
                Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
              }
              pvVar8 = Curl_hash_pick(local_298,local_138,sVar6 + 1);
              if (pvVar8 != (void *)0x0) {
                if ((((data->set).field_0x89f & 0x40) != 0) &&
                   ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar3->log_level)))) {
                  Curl_infof(data,"RESOLVE %.*s:%ld - old addresses discarded",
                             (ulong)(uint)local_2b8.len,local_2b8.str,local_2c0);
                }
                Curl_hash_delete(local_298,local_138,sVar6 + 1);
              }
              pcVar9 = local_2b8.str;
              sVar6 = CONCAT44(local_2b8.len._4_4_,(uint)local_2b8.len);
              iVar5 = (int)local_2c0;
              in_R8 = local_2c0 & 0xffffffff;
              p = Curl_dnscache_mk_entry(data,addr,local_2b8.str,sVar6,(int)local_2c0,cVar2 != '+');
              if (p == (Curl_dns_entry *)0x0) {
LAB_00132dd8:
                if ((Curl_multi *)data->share != local_2a0) {
                  return CURLE_OUT_OF_MEMORY;
                }
                Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
                return CURLE_OUT_OF_MEMORY;
              }
              sVar6 = create_dnscache_id(pcVar9,sVar6,iVar5,(char *)local_248,in_R8);
              h = local_298;
              pvVar8 = Curl_hash_add(local_298,local_248,sVar6 + 1,p);
              pCVar13 = local_2a0;
              if (pvVar8 == (void *)0x0) {
                Curl_freeaddrinfo(p->addr);
                (*Curl_cfree)(p);
                goto LAB_00132dd8;
              }
              *(long *)((long)pvVar8 + 0x10) = *(long *)((long)pvVar8 + 0x10) + 1;
              *(long *)((long)pvVar8 + 0x10) = *(long *)((long)pvVar8 + 0x10) + -1;
              if ((Curl_multi *)data->share == local_2a0) {
                Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
              }
              if ((((data->set).field_0x89f & 0x40) != 0) &&
                 ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar3->log_level)))) {
                pcVar9 = " (non-permanent)";
                if (cVar2 != '+') {
                  pcVar9 = "";
                }
                in_R8 = local_2c0;
                Curl_infof(data,"Added %.*s:%ld:%s to DNS cache%s",(ulong)(uint)local_2b8.len,
                           local_2b8.str,local_2c0,local_290,pcVar9);
              }
              iVar5 = Curl_str_casecompare(&local_2b8,"*");
              if (iVar5 != 0) {
                if ((((data->set).field_0x89f & 0x40) != 0) &&
                   ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar3->log_level)))) {
                  Curl_infof(data,"RESOLVE *:%ld using wildcard",local_2c0);
                }
                puVar1 = &(data->state).field_0x7c0;
                *puVar1 = *puVar1 | 4;
              }
            }
          }
        }
LAB_00132af8:
        pcVar10 = pcVar10->next;
      } while (pcVar10 != (curl_slist *)0x0);
    }
    (data->state).resolve = (curl_slist *)0x0;
    CVar11 = CURLE_OK;
  }
  return CVar11;
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct Curl_dnscache *dnscache = dnscache_get(data);
  struct curl_slist *hostp;

  if(!dnscache)
    return CURLE_FAILED_INIT;

  /* Default is no wildcard found */
  data->state.wildcard_resolve = FALSE;

  for(hostp = data->state.resolve; hostp; hostp = hostp->next) {
    char entry_id[MAX_HOSTCACHE_LEN];
    const char *host = hostp->data;
    struct Curl_str source;
    if(!host)
      continue;
    if(*host == '-') {
      curl_off_t num = 0;
      size_t entry_len;
      host++;
      if(!Curl_str_single(&host, '[')) {
        if(Curl_str_until(&host, &source, MAX_IPADR_LEN, ']') ||
           Curl_str_single(&host, ']') ||
           Curl_str_single(&host, ':'))
          continue;
      }
      else {
        if(Curl_str_until(&host, &source, 4096, ':') ||
           Curl_str_single(&host, ':')) {
          continue;
        }
      }

      if(!Curl_str_number(&host, &num, 0xffff)) {
        /* Create an entry id, based upon the hostname and port */
        entry_len = create_dnscache_id(Curl_str(&source),
                                       Curl_strlen(&source), (int)num,
                                       entry_id, sizeof(entry_id));
        dnscache_lock(data, dnscache);
        /* delete entry, ignore if it did not exist */
        Curl_hash_delete(&dnscache->entries, entry_id, entry_len + 1);
        dnscache_unlock(data, dnscache);
      }
    }
    else {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *head = NULL, *tail = NULL;
      size_t entry_len;
      char address[64];
#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      const char *addresses = NULL;
#endif
      curl_off_t port = 0;
      bool permanent = TRUE;
      bool error = TRUE;

      if(*host == '+') {
        host++;
        permanent = FALSE;
      }
      if(!Curl_str_single(&host, '[')) {
        if(Curl_str_until(&host, &source, MAX_IPADR_LEN, ']') ||
           Curl_str_single(&host, ']'))
          continue;
      }
      else {
        if(Curl_str_until(&host, &source, 4096, ':'))
          continue;
      }
      if(Curl_str_single(&host, ':') ||
         Curl_str_number(&host, &port, 0xffff) ||
         Curl_str_single(&host, ':'))
        goto err;

#if !defined(CURL_DISABLE_VERBOSE_STRINGS)
      addresses = host;
#endif

      /* start the address section */
      while(*host) {
        struct Curl_str target;
        struct Curl_addrinfo *ai;

        if(!Curl_str_single(&host, '[')) {
          if(Curl_str_until(&host, &target, MAX_IPADR_LEN, ']') ||
             Curl_str_single(&host, ']'))
            goto err;
        }
        else {
          if(Curl_str_until(&host, &target, 4096, ',')) {
            if(Curl_str_single(&host, ','))
              goto err;
            /* survive nothing but just a comma */
            continue;
          }
        }
#ifndef USE_IPV6
        if(memchr(target.str, ':', target.len)) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.",
                address);
          if(Curl_str_single(&host, ','))
            goto err;
          continue;
        }
#endif

        if(Curl_strlen(&target) >= sizeof(address))
          goto err;

        memcpy(address, Curl_str(&target), Curl_strlen(&target));
        address[Curl_strlen(&target)] = '\0';

        ai = Curl_str2addr(address, (int)port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
        if(Curl_str_single(&host, ','))
          break;
      }

      if(!head)
        goto err;

      error = FALSE;
err:
      if(error) {
        failf(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'",
              hostp->data);
        Curl_freeaddrinfo(head);
        return CURLE_SETOPT_OPTION_SYNTAX;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_len = create_dnscache_id(Curl_str(&source), Curl_strlen(&source),
                                     (int)port,
                                     entry_id, sizeof(entry_id));

      dnscache_lock(data, dnscache);

      /* See if it is already in our dns cache */
      dns = Curl_hash_pick(&dnscache->entries, entry_id, entry_len + 1);

      if(dns) {
        infof(data, "RESOLVE %.*s:%" CURL_FORMAT_CURL_OFF_T
              " - old addresses discarded", (int)Curl_strlen(&source),
              Curl_str(&source), port);
        /* delete old entry, there are two reasons for this
         1. old entry may have different addresses.
         2. even if entry with correct addresses is already in the cache,
            but if it is close to expire, then by the time next http
            request is made, it can get expired and pruned because old
            entry is not necessarily marked as permanent.
         3. when adding a non-permanent entry, we want it to remove and
            replace an existing permanent entry.
         4. when adding a non-permanent entry, we want it to get a "fresh"
            timeout that starts _now_. */

        Curl_hash_delete(&dnscache->entries, entry_id, entry_len + 1);
      }

      /* put this new host in the cache */
      dns = dnscache_add_addr(data, dnscache, head, Curl_str(&source),
                              Curl_strlen(&source), (int)port, permanent);
      if(dns) {
        /* release the returned reference; the cache itself will keep the
         * entry alive: */
        dns->refcount--;
      }

      dnscache_unlock(data, dnscache);

      if(!dns)
        return CURLE_OUT_OF_MEMORY;

#ifndef CURL_DISABLE_VERBOSE_STRINGS
      infof(data, "Added %.*s:%" CURL_FORMAT_CURL_OFF_T ":%s to DNS cache%s",
            (int)Curl_strlen(&source), Curl_str(&source), port, addresses,
            permanent ? "" : " (non-permanent)");
#endif

      /* Wildcard hostname */
      if(Curl_str_casecompare(&source, "*")) {
        infof(data, "RESOLVE *:%" CURL_FORMAT_CURL_OFF_T " using wildcard",
              port);
        data->state.wildcard_resolve = TRUE;
      }
    }
  }
  data->state.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}